

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTestFile.cpp
# Opt level: O0

bool Imf_2_5::isOpenExrFile(IStream *is,bool *tiled,bool *deep,bool *multiPart)

{
  bool bVar1;
  IStream *pIVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  int version;
  int magic;
  Int64 pos;
  undefined5 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffad;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  IStream *in;
  undefined4 local_44;
  undefined4 local_40;
  
  pIVar2 = (IStream *)(**(code **)(*in_RDI + 0x28))();
  in = pIVar2;
  if (pIVar2 != (IStream *)0x0) {
    (**(code **)(*in_RDI + 0x30))(in_RDI,0);
  }
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
            (in,(int *)CONCAT17(in_stack_ffffffffffffffaf,
                                CONCAT16(in_stack_ffffffffffffffae,
                                         CONCAT15(in_stack_ffffffffffffffad,
                                                  in_stack_ffffffffffffffa8))));
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
            (in,(int *)CONCAT17(in_stack_ffffffffffffffaf,
                                CONCAT16(in_stack_ffffffffffffffae,
                                         CONCAT15(in_stack_ffffffffffffffad,
                                                  in_stack_ffffffffffffffa8))));
  (**(code **)(*in_RDI + 0x30))(in_RDI,pIVar2);
  bVar1 = isTiled(local_44);
  *(bool *)in_RSI = bVar1;
  bVar1 = isNonImage(local_44);
  *(bool *)in_RDX = bVar1;
  bVar1 = isMultiPart(local_44);
  *(bool *)in_RCX = bVar1;
  return local_40 == 0x1312f76;
}

Assistant:

bool
isOpenExrFile
    (IStream &is,
     bool &tiled,
     bool &deep,
     bool &multiPart)
{
    try
    {
	Int64 pos = is.tellg();

	if (pos != 0)
	    is.seekg (0);

	int magic, version;
	Xdr::read <StreamIO> (is, magic);
	Xdr::read <StreamIO> (is, version);

	is.seekg (pos);

	tiled = isTiled (version);
	deep = isNonImage (version);
	multiPart = isMultiPart (version);
	return magic == MAGIC;
    }
    catch (...)
    {
	is.clear();
	tiled = false;
	return false;
    }
}